

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsics.cpp
# Opt level: O1

TestCaseGroup * vkt::sparse::createSparseResourcesShaderIntrinsicsTests(TestContext *testCtx)

{
  ImageType IVar1;
  ulong uVar2;
  int iVar3;
  long *plVar4;
  TestNode *this;
  ostream *poVar5;
  TestCaseGroup *pTVar6;
  SparseShaderIntrinsicsCaseBase *this_00;
  size_type *psVar7;
  ImageType imageType;
  TextureFormat *format;
  SpirVFunction function;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ImageParameters *pIVar11;
  UVec3 imageSize;
  ostringstream stream;
  string local_250;
  TestContext *local_230;
  TestNode *local_228;
  ulong local_220;
  UVec3 local_218;
  TextureFormat *local_208;
  uint local_1fc;
  TestNode *local_1f8;
  string *local_1f0;
  long local_1e8;
  long local_1e0;
  undefined **local_1d8;
  undefined **local_1d0;
  undefined **local_1c8;
  undefined **local_1c0;
  _func_int **local_1b8;
  ulong local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1f8 = (TestNode *)operator_new(0x70);
  local_230 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_1f8,testCtx,"shader_intrinsics",
             "Sparse Resources Shader Intrinsics");
  if (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::imageParametersArray == '\0') {
    createSparseResourcesShaderIntrinsicsTests();
  }
  if (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::formats == '\0') {
    createSparseResourcesShaderIntrinsicsTests();
  }
  if (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                                 functions_abi_cxx11_);
    if (iVar3 != 0) {
      createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_[0].
      _M_dataplus._M_p =
           (pointer)&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                     functions_abi_cxx11_[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_
                 ,"_sparse_fetch","");
      createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_[1].
      _M_dataplus._M_p =
           (pointer)&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                     functions_abi_cxx11_[1].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                  functions_abi_cxx11_ + 1),"_sparse_read","");
      createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_[2].
      _M_dataplus._M_p =
           (pointer)&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                     functions_abi_cxx11_[2].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                  functions_abi_cxx11_ + 2),"_sparse_sample_explicit_lod","");
      createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_[3].
      _M_dataplus._M_p =
           (pointer)&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                     functions_abi_cxx11_[3].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                  functions_abi_cxx11_ + 3),"_sparse_sample_implicit_lod","");
      createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_[4].
      _M_dataplus._M_p =
           (pointer)&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                     functions_abi_cxx11_[4].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                  functions_abi_cxx11_ + 4),"_sparse_gather","");
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                           functions_abi_cxx11_);
    }
  }
  uVar8 = 0;
  local_1c0 = &PTR__TestCase_00d63988;
  local_1c8 = &PTR__TestCase_00d63638;
  local_1d0 = &PTR__TestCase_00d63708;
  local_1d8 = &PTR__TestCase_00d63770;
  local_1b8 = (_func_int **)&PTR__TestCase_00d63a00;
  do {
    local_1f0 = createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_
                + uVar8;
    function = (SpirVFunction)uVar8;
    local_1b0 = uVar8 & 0xffffffff;
    pIVar11 = createSparseResourcesShaderIntrinsicsTests::imageParametersArray;
    lVar9 = 0;
    do {
      IVar1 = createSparseResourcesShaderIntrinsicsTests::imageParametersArray[lVar9].imageType;
      local_228 = (TestNode *)operator_new(0x70);
      local_220 = (ulong)IVar1;
      getImageTypeName_abi_cxx11_(&local_250,(sparse *)(ulong)IVar1,imageType);
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_250,(ulong)(local_1f0->_M_dataplus)._M_p);
      uVar2 = local_220;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_1a8[0].field_2._0_8_ = *psVar7;
        local_1a8[0].field_2._8_8_ = plVar4[3];
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      }
      else {
        local_1a8[0].field_2._0_8_ = *psVar7;
        local_1a8[0]._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_1a8[0]._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_228,local_230,local_1a8[0]._M_dataplus._M_p,"");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      local_1fc = (int)uVar2 - 4;
      lVar10 = 0;
      local_1e8 = lVar9;
      do {
        this = (TestNode *)operator_new(0x70);
        local_208 = createSparseResourcesShaderIntrinsicsTests::formats + lVar10;
        getShaderImageFormatQualifier_abi_cxx11_(local_1a8,(sparse *)local_208,format);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)this,local_230,local_1a8[0]._M_dataplus._M_p,"");
        local_1e0 = lVar10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        lVar9 = 4;
        do {
          local_218.m_data[2] = *(uint *)((long)pIVar11->imageSizes[0].m_data + lVar9 + 4);
          local_218.m_data._0_8_ = *(undefined8 *)((long)pIVar11->imageSizes[0].m_data + lVar9 + -4)
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_",1);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          if ((function - SPARSE_SAMPLE_EXPLICIT_LOD < 3) || (function == SPARSE_FETCH)) {
            if (2 < local_1fc) {
              pTVar6 = (TestCaseGroup *)
                       (*(code *)(&DAT_00b6c0e8 + *(int *)(&DAT_00b6c0e8 + local_1b0 * 4)))();
              return pTVar6;
            }
          }
          else {
            this_00 = (SparseShaderIntrinsicsCaseBase *)operator_new(0x90);
            std::__cxx11::stringbuf::str();
            SparseShaderIntrinsicsCaseBase::SparseShaderIntrinsicsCaseBase
                      (this_00,local_230,&local_250,function,(ImageType)local_220,&local_218,
                       local_208);
            (this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = local_1b8;
            tcu::TestNode::addChild(this,(TestNode *)this_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          lVar9 = lVar9 + 0xc;
        } while (lVar9 != 0x34);
        tcu::TestNode::addChild(local_228,this);
        lVar9 = local_1e8;
        lVar10 = local_1e0 + 1;
      } while (lVar10 != 6);
      tcu::TestNode::addChild(local_1f8,local_228);
      lVar9 = lVar9 + 1;
      pIVar11 = pIVar11 + 1;
    } while (lVar9 != 5);
    uVar8 = uVar8 + 1;
  } while (uVar8 != 5);
  return (TestCaseGroup *)local_1f8;
}

Assistant:

tcu::TestCaseGroup* createSparseResourcesShaderIntrinsicsTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "shader_intrinsics", "Sparse Resources Shader Intrinsics"));

	static const deUint32 sizeCountPerImageType = 4u;

	struct ImageParameters
	{
		ImageType	imageType;
		tcu::UVec3	imageSizes[sizeCountPerImageType];
	};

	static const ImageParameters imageParametersArray[] =
	{
		{ IMAGE_TYPE_2D,		{ tcu::UVec3(512u, 256u, 1u),	tcu::UVec3(128u, 128u, 1u), tcu::UVec3(503u, 137u, 1u), tcu::UVec3(11u, 37u, 1u) } },
		{ IMAGE_TYPE_2D_ARRAY,	{ tcu::UVec3(512u, 256u, 6u),	tcu::UVec3(128u, 128u, 8u),	tcu::UVec3(503u, 137u, 3u),	tcu::UVec3(11u, 37u, 3u) } },
		{ IMAGE_TYPE_CUBE,		{ tcu::UVec3(256u, 256u, 1u),	tcu::UVec3(128u, 128u, 1u),	tcu::UVec3(137u, 137u, 1u),	tcu::UVec3(11u, 11u, 1u) } },
		{ IMAGE_TYPE_CUBE_ARRAY,{ tcu::UVec3(256u, 256u, 6u),	tcu::UVec3(128u, 128u, 8u),	tcu::UVec3(137u, 137u, 3u),	tcu::UVec3(11u, 11u, 3u) } },
		{ IMAGE_TYPE_3D,		{ tcu::UVec3(256u, 256u, 16u),	tcu::UVec3(128u, 128u, 8u),	tcu::UVec3(503u, 137u, 3u),	tcu::UVec3(11u, 37u, 3u) } }
	};

	static const tcu::TextureFormat formats[] =
	{
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT8)
	};

	static const std::string functions[SPARSE_SPIRV_FUNCTION_TYPE_LAST] =
	{
		"_sparse_fetch",
		"_sparse_read",
		"_sparse_sample_explicit_lod",
		"_sparse_sample_implicit_lod",
		"_sparse_gather",
	};

	for (deUint32 functionNdx = 0; functionNdx < SPARSE_SPIRV_FUNCTION_TYPE_LAST; ++functionNdx)
	{
		const SpirVFunction function = static_cast<SpirVFunction>(functionNdx);

		for (deInt32 imageTypeNdx = 0; imageTypeNdx < DE_LENGTH_OF_ARRAY(imageParametersArray); ++imageTypeNdx)
		{
			const ImageType					imageType = imageParametersArray[imageTypeNdx].imageType;
			de::MovePtr<tcu::TestCaseGroup> imageTypeGroup(new tcu::TestCaseGroup(testCtx, (getImageTypeName(imageType) + functions[functionNdx]).c_str(), ""));

			for (deInt32 formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); ++formatNdx)
			{
				const tcu::TextureFormat&		format = formats[formatNdx];
				de::MovePtr<tcu::TestCaseGroup> formatGroup(new tcu::TestCaseGroup(testCtx, getShaderImageFormatQualifier(format).c_str(), ""));

				for (deInt32 imageSizeNdx = 0; imageSizeNdx < DE_LENGTH_OF_ARRAY(imageParametersArray[imageTypeNdx].imageSizes); ++imageSizeNdx)
				{
					const tcu::UVec3 imageSize = imageParametersArray[imageTypeNdx].imageSizes[imageSizeNdx];

					std::ostringstream stream;
					stream << imageSize.x() << "_" << imageSize.y() << "_" << imageSize.z();

					switch (function)
					{
					case SPARSE_FETCH:
						if ((imageType == IMAGE_TYPE_CUBE) || (imageType == IMAGE_TYPE_CUBE_ARRAY)) continue;
					case SPARSE_SAMPLE_EXPLICIT_LOD:
					case SPARSE_SAMPLE_IMPLICIT_LOD:
					case SPARSE_GATHER:
						if ((imageType == IMAGE_TYPE_CUBE) || (imageType == IMAGE_TYPE_CUBE_ARRAY) || (imageType == IMAGE_TYPE_3D)) continue;
						break;
					default:
						break;
					}

					switch (function)
					{
					case SPARSE_FETCH:
						formatGroup->addChild(new SparseCaseOpImageSparseFetch(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					case SPARSE_READ:
						formatGroup->addChild(new SparseCaseOpImageSparseRead(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					case SPARSE_SAMPLE_EXPLICIT_LOD:
						formatGroup->addChild(new SparseCaseOpImageSparseSampleExplicitLod(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					case SPARSE_SAMPLE_IMPLICIT_LOD:
						formatGroup->addChild(new SparseCaseOpImageSparseSampleImplicitLod(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					case SPARSE_GATHER:
						formatGroup->addChild(new SparseCaseOpImageSparseGather(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					default:
						DE_ASSERT(0);
						break;
					}
				}
				imageTypeGroup->addChild(formatGroup.release());
			}
			testGroup->addChild(imageTypeGroup.release());
		}
	}

	return testGroup.release();
}